

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMemory.cpp
# Opt level: O1

int adios2::helper::NdCopy
              (char *in,CoreDims *inStart,CoreDims *inCount,bool inIsRowMajor,bool inIsLittleEndian,
              char *out,CoreDims *outStart,CoreDims *outCount,bool outIsRowMajor,
              bool outIsLittleEndian,int typeSize,CoreDims *inMemStart,CoreDims *inMemCount,
              CoreDims *outMemStart,CoreDims *outMemCount,bool safeMode,MemorySpace MemSpace,
              bool duringWrite)

{
  char ******ppppppcVar1;
  size_t *psVar2;
  byte bVar3;
  CoreDims *pCVar4;
  size_t *psVar5;
  size_t *psVar6;
  size_t *psVar7;
  size_t *psVar8;
  size_t **ppsVar9;
  ulong uVar10;
  char *******pppppppcVar11;
  undefined7 in_register_00000009;
  size_t *psVar12;
  size_t *psVar13;
  char *******pppppppcVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  ulong minCountDim;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  undefined7 in_register_00000081;
  char *__dest;
  size_t elmSize;
  char *pcVar24;
  bool bVar25;
  size_t sVar26;
  allocator_type local_1379;
  char *local_1378;
  char *local_1370;
  char *local_1368;
  CoreDims *local_1360;
  undefined4 local_1358;
  undefined4 local_1354;
  DimsArray inStride;
  DimsArray outStride;
  DimsArray ovlpStart;
  DimsArray ovlpCount;
  DimsArray revInStart;
  DimsArray ovlpEnd;
  size_t blockSize;
  char *******local_ce8;
  char ******local_ce0 [32];
  size_t minContDim;
  char **local_bd8;
  char *local_bd0 [32];
  DimsArray outMemStartNC;
  DimsArray inMemStartNC;
  DimsArray outEnd;
  DimsArray inEnd;
  DimsArray outMemCountNC;
  DimsArray inMemCountNC;
  DimsArray outRltvOvlpStartPos;
  DimsArray inRltvOvlpStartPos;
  DimsArray outOvlpGapSize;
  DimsArray inOvlpGapSize;
  
  local_1358 = (undefined4)CONCAT71(in_register_00000081,inIsLittleEndian);
  local_1354 = (undefined4)CONCAT71(in_register_00000009,inIsRowMajor);
  if (inMemStart->DimCount == 0) {
    inMemStart = inStart;
  }
  sVar15 = inMemStart->DimCount;
  psVar13 = inMemStartNC.Dimensions;
  local_1368 = out;
  local_1360 = inCount;
  inMemStartNC.super_CoreDims.DimCount = sVar15;
  inMemStartNC.super_CoreDims.DimensSpan = psVar13;
  memset(psVar13,0,0x100);
  if (sVar15 != 0) {
    memmove(psVar13,inMemStart->DimensSpan,sVar15 << 3);
  }
  if (inMemCount->DimCount == 0) {
    inMemCount = local_1360;
  }
  sVar15 = inMemCount->DimCount;
  psVar13 = inMemCountNC.Dimensions;
  inMemCountNC.super_CoreDims.DimCount = sVar15;
  inMemCountNC.super_CoreDims.DimensSpan = psVar13;
  memset(psVar13,0,0x100);
  if (sVar15 != 0) {
    memmove(psVar13,inMemCount->DimensSpan,sVar15 << 3);
  }
  if (outMemStart->DimCount == 0) {
    outMemStart = outStart;
  }
  sVar15 = outMemStart->DimCount;
  psVar13 = outMemStartNC.Dimensions;
  outMemStartNC.super_CoreDims.DimCount = sVar15;
  outMemStartNC.super_CoreDims.DimensSpan = psVar13;
  memset(psVar13,0,0x100);
  if (sVar15 != 0) {
    memmove(psVar13,outMemStart->DimensSpan,sVar15 << 3);
  }
  if (outMemCount->DimCount == 0) {
    outMemCount = outCount;
  }
  sVar15 = outMemCount->DimCount;
  psVar13 = outMemCountNC.Dimensions;
  outMemCountNC.super_CoreDims.DimCount = sVar15;
  outMemCountNC.super_CoreDims.DimensSpan = psVar13;
  memset(psVar13,0,0x100);
  if (sVar15 != 0) {
    memmove(psVar13,outMemCount->DimensSpan,sVar15 << 3);
  }
  sVar15 = inStart->DimCount;
  inEnd.super_CoreDims.DimensSpan = inEnd.Dimensions;
  inEnd.super_CoreDims.DimCount = sVar15;
  memset(inEnd.super_CoreDims.DimensSpan,0,0x100);
  outEnd.super_CoreDims.DimensSpan = outEnd.Dimensions;
  outEnd.super_CoreDims.DimCount = sVar15;
  memset(outEnd.super_CoreDims.DimensSpan,0,0x100);
  ovlpStart.super_CoreDims.DimensSpan = ovlpStart.Dimensions;
  ovlpStart.super_CoreDims.DimCount = sVar15;
  memset(ovlpStart.super_CoreDims.DimensSpan,0,0x100);
  ovlpEnd.super_CoreDims.DimensSpan = ovlpEnd.Dimensions;
  ovlpEnd.super_CoreDims.DimCount = sVar15;
  memset(ovlpEnd.super_CoreDims.DimensSpan,0,0x100);
  ovlpCount.super_CoreDims.DimensSpan = ovlpCount.Dimensions;
  ovlpCount.super_CoreDims.DimCount = sVar15;
  memset(ovlpCount.super_CoreDims.DimensSpan,0,0x100);
  inStride.super_CoreDims.DimensSpan = inStride.Dimensions;
  inStride.super_CoreDims.DimCount = sVar15;
  memset(inStride.super_CoreDims.DimensSpan,0,0x100);
  outStride.super_CoreDims.DimensSpan = outStride.Dimensions;
  outStride.super_CoreDims.DimCount = sVar15;
  memset(outStride.super_CoreDims.DimensSpan,0,0x100);
  inOvlpGapSize.super_CoreDims.DimensSpan = inOvlpGapSize.Dimensions;
  inOvlpGapSize.super_CoreDims.DimCount = sVar15;
  memset(inOvlpGapSize.super_CoreDims.DimensSpan,0,0x100);
  outOvlpGapSize.super_CoreDims.DimensSpan = outOvlpGapSize.Dimensions;
  outOvlpGapSize.super_CoreDims.DimCount = sVar15;
  memset(outOvlpGapSize.super_CoreDims.DimensSpan,0,0x100);
  inRltvOvlpStartPos.super_CoreDims.DimensSpan = inRltvOvlpStartPos.Dimensions;
  inRltvOvlpStartPos.super_CoreDims.DimCount = sVar15;
  memset(inRltvOvlpStartPos.super_CoreDims.DimensSpan,0,0x100);
  outRltvOvlpStartPos.super_CoreDims.DimensSpan = outRltvOvlpStartPos.Dimensions;
  sVar26 = 0x3fc75d;
  outRltvOvlpStartPos.super_CoreDims.DimCount = sVar15;
  memset(outRltvOvlpStartPos.super_CoreDims.DimensSpan,0,0x100);
  local_1370 = (char *)0x0;
  local_1378 = (char *)0x0;
  bVar3 = (byte)local_1354;
  if ((bVar3 ^ 1) == 0 && outIsRowMajor) {
    if (sVar15 != 0) {
      psVar13 = inStart->DimensSpan;
      psVar2 = local_1360->DimensSpan;
      sVar23 = 0;
      do {
        inEnd.Dimensions[sVar23] = (psVar13[sVar23] + psVar2[sVar23]) - 1;
        sVar23 = sVar23 + 1;
      } while (sVar15 != sVar23);
    }
    sVar15 = outStart->DimCount;
    if (sVar15 != 0) {
      psVar13 = outStart->DimensSpan;
      psVar2 = outCount->DimensSpan;
      sVar23 = 0;
      do {
        outEnd.Dimensions[sVar23] = (psVar13[sVar23] + psVar2[sVar23]) - 1;
        sVar23 = sVar23 + 1;
      } while (sVar15 != sVar23);
    }
    if (ovlpStart.super_CoreDims.DimCount != 0) {
      psVar13 = inStart->DimensSpan;
      psVar2 = outStart->DimensSpan;
      uVar17 = 0;
      do {
        uVar10 = psVar2[uVar17];
        if (psVar2[uVar17] < psVar13[uVar17]) {
          uVar10 = psVar13[uVar17];
        }
        ovlpStart.Dimensions[uVar17] = uVar10;
        uVar17 = uVar17 + 1;
      } while (uVar17 < ovlpStart.super_CoreDims.DimCount);
    }
    if (ovlpEnd.super_CoreDims.DimCount != 0) {
      uVar17 = 0;
      do {
        uVar10 = outEnd.Dimensions[uVar17];
        if (inEnd.Dimensions[uVar17] < outEnd.Dimensions[uVar17]) {
          uVar10 = inEnd.Dimensions[uVar17];
        }
        ovlpEnd.Dimensions[uVar17] = uVar10;
        uVar17 = uVar17 + 1;
      } while (uVar17 < ovlpEnd.super_CoreDims.DimCount);
    }
    if (ovlpCount.super_CoreDims.DimCount != 0) {
      uVar17 = 0;
      do {
        ovlpCount.Dimensions[uVar17] =
             (ovlpEnd.Dimensions[uVar17] - ovlpStart.Dimensions[uVar17]) + 1;
        uVar17 = uVar17 + 1;
      } while (uVar17 < ovlpCount.super_CoreDims.DimCount);
    }
    bVar25 = ovlpStart.super_CoreDims.DimCount == 0;
    if (!bVar25) {
      if (ovlpEnd.Dimensions[0] < ovlpStart.Dimensions[0]) {
        return 1;
      }
      uVar17 = 1;
      do {
        uVar10 = uVar17;
        if (ovlpStart.super_CoreDims.DimCount == uVar10) break;
        uVar17 = uVar10 + 1;
      } while (ovlpStart.Dimensions[uVar10] <= ovlpEnd.Dimensions[uVar10]);
      bVar25 = ovlpStart.super_CoreDims.DimCount <= uVar10;
    }
    if (!bVar25) {
      return 1;
    }
    uVar17 = (ulong)typeSize;
    inStride.Dimensions[inStride.super_CoreDims.DimCount - 1] = uVar17;
    if (1 < inStride.super_CoreDims.DimCount) {
      inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
           inMemCountNC.Dimensions[inStride.super_CoreDims.DimCount - 1] * uVar17;
    }
    if (2 < inStride.super_CoreDims.DimCount) {
      sVar15 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
      sVar23 = inStride.super_CoreDims.DimCount;
      do {
        sVar15 = sVar15 * inMemCountNC.Dimensions[sVar23 - 2];
        *(size_t *)(&local_1358 + sVar23 * 2) = sVar15;
        sVar23 = sVar23 - 1;
      } while (sVar23 != 2);
    }
    outStride.Dimensions[outStride.super_CoreDims.DimCount - 1] = uVar17;
    if (1 < outStride.super_CoreDims.DimCount) {
      outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
           outMemCountNC.Dimensions[outStride.super_CoreDims.DimCount - 1] * uVar17;
    }
    if (2 < outStride.super_CoreDims.DimCount) {
      sVar15 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
      sVar23 = outStride.super_CoreDims.DimCount;
      do {
        sVar15 = sVar15 * outMemCountNC.Dimensions[sVar23 - 2];
        outStride.Dimensions[sVar23 - 3] = sVar15;
        sVar23 = sVar23 - 1;
      } while (sVar23 != 2);
    }
    sVar15 = ovlpCount.super_CoreDims.DimCount;
    if (inOvlpGapSize.super_CoreDims.DimCount != 0) {
      uVar10 = 0;
      do {
        inOvlpGapSize.Dimensions[uVar10] =
             (inMemCountNC.Dimensions[uVar10] - ovlpCount.Dimensions[uVar10]) *
             inStride.Dimensions[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar10 < inOvlpGapSize.super_CoreDims.DimCount);
    }
    if (outOvlpGapSize.super_CoreDims.DimCount != 0) {
      uVar10 = 0;
      do {
        outOvlpGapSize.Dimensions[uVar10] =
             (outMemCountNC.Dimensions[uVar10] - ovlpCount.Dimensions[uVar10]) *
             outStride.Dimensions[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar10 < outOvlpGapSize.super_CoreDims.DimCount);
    }
    local_1370 = in;
    if (inMemStartNC.super_CoreDims.DimCount != 0) {
      sVar23 = 0;
      do {
        in = in + (ovlpStart.Dimensions[sVar23] - inMemStartNC.Dimensions[sVar23]) *
                  inStride.Dimensions[sVar23];
        sVar23 = sVar23 + 1;
        local_1370 = in;
      } while (inMemStartNC.super_CoreDims.DimCount != sVar23);
    }
    local_1378 = local_1368;
    uVar20 = ovlpCount.super_CoreDims.DimCount;
    uVar10 = ovlpCount.super_CoreDims.DimCount;
    if (outMemStartNC.super_CoreDims.DimCount != 0) {
      sVar23 = 0;
      do {
        local_1378 = local_1378 +
                     (ovlpStart.Dimensions[sVar23] - outMemStartNC.Dimensions[sVar23]) *
                     outStride.Dimensions[sVar23];
        sVar23 = sVar23 + 1;
      } while (outMemStartNC.super_CoreDims.DimCount != sVar23);
    }
    while (uVar10 = uVar10 - 1, uVar10 != 0) {
      minCountDim = uVar10;
      if ((inMemCountNC.super_CoreDims.DimensSpan[uVar10] !=
           ovlpCount.super_CoreDims.DimensSpan[uVar10]) ||
         (minCountDim = uVar20 - 1, uVar20 = minCountDim,
         outMemCountNC.super_CoreDims.DimensSpan[uVar10] !=
         ovlpCount.super_CoreDims.DimensSpan[uVar10])) goto LAB_003fda39;
    }
    minCountDim = 0;
LAB_003fda39:
    uVar10 = minCountDim;
    uVar20 = uVar17;
    if (minCountDim < ovlpCount.super_CoreDims.DimCount) {
      do {
        uVar20 = uVar20 * ovlpCount.super_CoreDims.DimensSpan[uVar10];
        uVar10 = uVar10 + 1;
      } while (ovlpCount.super_CoreDims.DimCount != uVar10);
    }
    blockSize = uVar20;
    minContDim = minCountDim;
    if ((bool)(char)local_1358 == outIsLittleEndian) {
      if (!safeMode) {
        NdCopyRecurDFSeqPadding
                  (0,&local_1370,&local_1378,&inOvlpGapSize.super_CoreDims,
                   &outOvlpGapSize.super_CoreDims,&ovlpCount.super_CoreDims,&minContDim,&blockSize);
        return 0;
      }
      psVar13 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = ovlpCount.super_CoreDims.DimCount;
      revInStart.super_CoreDims.DimensSpan = psVar13;
      memset(psVar13,0,0x100);
      if (sVar15 != 0) {
        memset(psVar13,0,sVar15 << 3);
      }
      uVar17 = 0;
      uVar10 = uVar17;
      pcVar24 = local_1370;
      __dest = local_1378;
      do {
        for (; uVar17 != minCountDim; uVar17 = uVar17 + 1) {
          revInStart.super_CoreDims.DimensSpan[uVar17] =
               revInStart.super_CoreDims.DimensSpan[uVar17] + 1;
          uVar10 = minCountDim;
        }
        memcpy(__dest,pcVar24,uVar20);
        pcVar24 = pcVar24 + uVar20;
        __dest = __dest + uVar20;
        do {
          uVar17 = uVar10 - 1;
          if (uVar10 == 0) {
            return 0;
          }
          pcVar24 = pcVar24 + inOvlpGapSize.super_CoreDims.DimensSpan[uVar10];
          __dest = __dest + outOvlpGapSize.super_CoreDims.DimensSpan[uVar10];
          revInStart.super_CoreDims.DimensSpan[uVar10] = 0;
          uVar10 = uVar17;
        } while (revInStart.super_CoreDims.DimensSpan[uVar17] ==
                 ovlpCount.super_CoreDims.DimensSpan[uVar17]);
      } while( true );
    }
    if (safeMode) {
      psVar13 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = ovlpCount.super_CoreDims.DimCount;
      revInStart.super_CoreDims.DimensSpan = psVar13;
      memset(psVar13,0,0x100);
      if (sVar15 != 0) {
        memset(psVar13,0,sVar15 << 3);
      }
      uVar10 = 0;
      uVar22 = uVar10;
      do {
        for (; uVar10 != minCountDim; uVar10 = uVar10 + 1) {
          revInStart.super_CoreDims.DimensSpan[uVar10] =
               revInStart.super_CoreDims.DimensSpan[uVar10] + 1;
          uVar22 = minCountDim;
        }
        if (uVar17 <= uVar20) {
          uVar21 = 0;
          uVar10 = uVar17;
          pcVar24 = local_1378;
          do {
            do {
              *local_1378 = (local_1370 + -1)[uVar10];
              local_1378 = local_1378 + 1;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            local_1370 = local_1370 + uVar17;
            local_1378 = pcVar24 + uVar17;
            uVar21 = uVar21 + 1;
            uVar10 = uVar17;
            pcVar24 = local_1378;
          } while (uVar21 != uVar20 / uVar17);
        }
        do {
          uVar10 = uVar22 - 1;
          if (uVar22 == 0) {
            return 0;
          }
          local_1370 = local_1370 + inOvlpGapSize.super_CoreDims.DimensSpan[uVar22];
          local_1378 = local_1378 + outOvlpGapSize.super_CoreDims.DimensSpan[uVar22];
          revInStart.super_CoreDims.DimensSpan[uVar22] = 0;
          uVar22 = uVar10;
        } while (revInStart.super_CoreDims.DimensSpan[uVar10] ==
                 ovlpCount.super_CoreDims.DimensSpan[uVar10]);
      } while( true );
    }
    NdCopyRecurDFSeqPaddingRevEndian
              (0,&local_1370,&local_1378,&inOvlpGapSize.super_CoreDims,
               &outOvlpGapSize.super_CoreDims,&ovlpCount.super_CoreDims,minCountDim,uVar17,
               uVar20 / uVar17,sVar26);
  }
  else {
    if (bVar3 == 0 && !outIsRowMajor) {
      if (sVar15 != 0) {
        psVar13 = inStart->DimensSpan;
        psVar2 = local_1360->DimensSpan;
        sVar26 = 0;
        do {
          inEnd.Dimensions[sVar26] = (psVar13[sVar26] + psVar2[sVar26]) - 1;
          sVar26 = sVar26 + 1;
        } while (sVar15 != sVar26);
      }
      sVar15 = outStart->DimCount;
      if (sVar15 != 0) {
        psVar13 = outStart->DimensSpan;
        psVar2 = outCount->DimensSpan;
        sVar26 = 0;
        do {
          outEnd.Dimensions[sVar26] = (psVar13[sVar26] + psVar2[sVar26]) - 1;
          sVar26 = sVar26 + 1;
        } while (sVar15 != sVar26);
      }
      if (ovlpStart.super_CoreDims.DimCount != 0) {
        psVar13 = inStart->DimensSpan;
        psVar2 = outStart->DimensSpan;
        uVar17 = 0;
        do {
          uVar10 = psVar2[uVar17];
          if (psVar2[uVar17] < psVar13[uVar17]) {
            uVar10 = psVar13[uVar17];
          }
          ovlpStart.Dimensions[uVar17] = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpStart.super_CoreDims.DimCount);
      }
      if (ovlpEnd.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          uVar10 = outEnd.Dimensions[uVar17];
          if (inEnd.Dimensions[uVar17] < outEnd.Dimensions[uVar17]) {
            uVar10 = inEnd.Dimensions[uVar17];
          }
          ovlpEnd.Dimensions[uVar17] = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpEnd.super_CoreDims.DimCount);
      }
      if (ovlpCount.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          ovlpCount.Dimensions[uVar17] =
               (ovlpEnd.Dimensions[uVar17] - ovlpStart.Dimensions[uVar17]) + 1;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpCount.super_CoreDims.DimCount);
      }
      bVar25 = ovlpStart.super_CoreDims.DimCount == 0;
      if (!bVar25) {
        if (ovlpEnd.Dimensions[0] < ovlpStart.Dimensions[0]) {
          return 1;
        }
        uVar17 = 1;
        do {
          uVar10 = uVar17;
          if (ovlpStart.super_CoreDims.DimCount == uVar10) break;
          uVar17 = uVar10 + 1;
        } while (ovlpStart.Dimensions[uVar10] <= ovlpEnd.Dimensions[uVar10]);
        bVar25 = ovlpStart.super_CoreDims.DimCount <= uVar10;
      }
      if (!bVar25) {
        return 1;
      }
      sVar15 = (size_t)typeSize;
      inStride.Dimensions[inStride.super_CoreDims.DimCount - 1] = sVar15;
      if (1 < inStride.super_CoreDims.DimCount) {
        inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
             local_1360->DimensSpan[inStride.super_CoreDims.DimCount - 1] * sVar15;
      }
      if (2 < inStride.super_CoreDims.DimCount) {
        psVar13 = local_1360->DimensSpan;
        sVar26 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
        sVar23 = inStride.super_CoreDims.DimCount;
        do {
          sVar26 = sVar26 * psVar13[sVar23 - 2];
          *(size_t *)(&local_1358 + sVar23 * 2) = sVar26;
          sVar23 = sVar23 - 1;
        } while (sVar23 != 2);
      }
      outStride.Dimensions[outStride.super_CoreDims.DimCount - 1] = sVar15;
      if (1 < outStride.super_CoreDims.DimCount) {
        outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
             sVar15 * outCount->DimensSpan[outStride.super_CoreDims.DimCount - 1];
      }
      if (2 < outStride.super_CoreDims.DimCount) {
        psVar13 = outCount->DimensSpan;
        sVar15 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
        sVar26 = outStride.super_CoreDims.DimCount;
        do {
          sVar15 = sVar15 * psVar13[sVar26 - 2];
          outStride.Dimensions[sVar26 - 3] = sVar15;
          sVar26 = sVar26 - 1;
        } while (sVar26 != 2);
      }
      if (inMemStartNC.super_CoreDims.DimCount != 0) {
        sVar15 = 0;
        do {
          inRltvOvlpStartPos.Dimensions[sVar15] =
               ovlpStart.Dimensions[sVar15] - inMemStartNC.Dimensions[sVar15];
          sVar15 = sVar15 + 1;
        } while (inMemStartNC.super_CoreDims.DimCount != sVar15);
      }
      if (outMemStartNC.super_CoreDims.DimCount != 0) {
        sVar15 = 0;
        do {
          outRltvOvlpStartPos.Dimensions[sVar15] =
               ovlpStart.Dimensions[sVar15] - outMemStartNC.Dimensions[sVar15];
          sVar15 = sVar15 + 1;
        } while (outMemStartNC.super_CoreDims.DimCount != sVar15);
      }
    }
    else if ((bVar3 ^ 1) == 0 && !outIsRowMajor) {
      sVar15 = outStart->DimCount;
      psVar13 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = sVar15;
      revInStart.super_CoreDims.DimensSpan = psVar13;
      memset(psVar13,0,0x100);
      if (sVar15 != 0) {
        memmove(psVar13,outStart->DimensSpan,sVar15 << 3);
      }
      sVar15 = outCount->DimCount;
      minContDim = sVar15;
      local_bd8 = local_bd0;
      memset(local_bd0,0,0x100);
      if (sVar15 != 0) {
        memmove(local_bd0,outCount->DimensSpan,sVar15 << 3);
      }
      psVar7 = outMemCountNC.super_CoreDims.DimensSpan;
      psVar6 = inEnd.super_CoreDims.DimensSpan;
      psVar5 = outEnd.super_CoreDims.DimensSpan;
      psVar2 = outMemStartNC.super_CoreDims.DimensSpan;
      psVar8 = outMemStartNC.super_CoreDims.DimensSpan + (outMemStartNC.super_CoreDims.DimCount - 1)
      ;
      psVar13 = outMemStartNC.super_CoreDims.DimensSpan;
      if (outMemStartNC.super_CoreDims.DimensSpan < psVar8 &&
          outMemStartNC.super_CoreDims.DimCount != 0) {
        do {
          psVar12 = psVar13 + 1;
          sVar15 = *psVar13;
          *psVar13 = *psVar8;
          *psVar8 = sVar15;
          psVar8 = psVar8 + -1;
          psVar13 = psVar12;
        } while (psVar12 < psVar8);
      }
      psVar8 = outMemCountNC.super_CoreDims.DimensSpan + (outMemCountNC.super_CoreDims.DimCount - 1)
      ;
      psVar13 = outMemCountNC.super_CoreDims.DimensSpan;
      if (outMemCountNC.super_CoreDims.DimensSpan < psVar8 &&
          outMemCountNC.super_CoreDims.DimCount != 0) {
        do {
          psVar12 = psVar13 + 1;
          sVar15 = *psVar13;
          *psVar13 = *psVar8;
          *psVar8 = sVar15;
          psVar8 = psVar8 + -1;
          psVar13 = psVar12;
        } while (psVar12 < psVar8);
      }
      if (inStart->DimCount != 0) {
        psVar13 = inStart->DimensSpan;
        psVar8 = local_1360->DimensSpan;
        uVar17 = 0;
        do {
          inEnd.super_CoreDims.DimensSpan[uVar17] = (psVar13[uVar17] + psVar8[uVar17]) - 1;
          uVar17 = uVar17 + 1;
        } while (uVar17 < inStart->DimCount);
      }
      if (revInStart.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          outEnd.super_CoreDims.DimensSpan[uVar17] =
               (size_t)(local_bd0[uVar17] + (revInStart.Dimensions[uVar17] - 1));
          uVar17 = uVar17 + 1;
        } while (uVar17 < revInStart.super_CoreDims.DimCount);
      }
      if (ovlpStart.super_CoreDims.DimCount != 0) {
        psVar13 = inStart->DimensSpan;
        uVar17 = 0;
        do {
          uVar10 = revInStart.Dimensions[uVar17];
          if (revInStart.Dimensions[uVar17] < psVar13[uVar17]) {
            uVar10 = psVar13[uVar17];
          }
          ovlpStart.super_CoreDims.DimensSpan[uVar17] = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpStart.super_CoreDims.DimCount);
      }
      if (ovlpEnd.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          uVar10 = psVar5[uVar17];
          if (psVar6[uVar17] < psVar5[uVar17]) {
            uVar10 = psVar6[uVar17];
          }
          ovlpEnd.Dimensions[uVar17] = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpEnd.super_CoreDims.DimCount);
      }
      if (ovlpCount.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          ovlpCount.Dimensions[uVar17] =
               (ovlpEnd.Dimensions[uVar17] - ovlpStart.super_CoreDims.DimensSpan[uVar17]) + 1;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpCount.super_CoreDims.DimCount);
      }
      bVar25 = ovlpStart.super_CoreDims.DimCount == 0;
      if (!bVar25) {
        if (ovlpEnd.Dimensions[0] < *ovlpStart.super_CoreDims.DimensSpan) {
          return 1;
        }
        uVar17 = 1;
        do {
          uVar10 = uVar17;
          if (ovlpStart.super_CoreDims.DimCount == uVar10) break;
          uVar17 = uVar10 + 1;
        } while (ovlpStart.super_CoreDims.DimensSpan[uVar10] <= ovlpEnd.Dimensions[uVar10]);
        bVar25 = ovlpStart.super_CoreDims.DimCount <= uVar10;
      }
      if (!bVar25) {
        return 1;
      }
      sVar15 = (size_t)typeSize;
      inStride.Dimensions[inStride.super_CoreDims.DimCount - 1] = sVar15;
      if (1 < inStride.super_CoreDims.DimCount) {
        inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
             inMemCountNC.super_CoreDims.DimensSpan[inStride.super_CoreDims.DimCount - 1] * sVar15;
      }
      psVar13 = inMemCountNC.super_CoreDims.DimensSpan;
      if (2 < inStride.super_CoreDims.DimCount) {
        sVar26 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
        sVar23 = inStride.super_CoreDims.DimCount;
        do {
          sVar26 = sVar26 * psVar13[sVar23 - 2];
          *(size_t *)(&local_1358 + sVar23 * 2) = sVar26;
          sVar23 = sVar23 - 1;
        } while (sVar23 != 2);
      }
      outStride.Dimensions[outStride.super_CoreDims.DimCount - 1] = sVar15;
      if (1 < outStride.super_CoreDims.DimCount) {
        outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
             sVar15 * psVar7[outStride.super_CoreDims.DimCount - 1];
      }
      if (2 < outStride.super_CoreDims.DimCount) {
        sVar15 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
        sVar26 = outStride.super_CoreDims.DimCount;
        do {
          sVar15 = sVar15 * psVar7[sVar26 - 2];
          outStride.Dimensions[sVar26 - 3] = sVar15;
          sVar26 = sVar26 - 1;
        } while (sVar26 != 2);
      }
      ppsVar9 = (size_t **)(outStride.Dimensions + (outStride.super_CoreDims.DimCount - 1));
      if (outStride.Dimensions < ppsVar9 && outStride.super_CoreDims.DimCount != 0) {
        psVar13 = outStride.Dimensions;
        do {
          psVar13 = psVar13 + 1;
          sVar15 = psVar13[-1];
          psVar13[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar15;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar13 < ppsVar9);
      }
      sVar15 = ovlpStart.super_CoreDims.DimCount;
      if (inMemStartNC.super_CoreDims.DimCount != 0) {
        sVar26 = 0;
        do {
          inRltvOvlpStartPos.Dimensions[sVar26] =
               ovlpStart.super_CoreDims.DimensSpan[sVar26] -
               inMemStartNC.super_CoreDims.DimensSpan[sVar26];
          sVar26 = sVar26 + 1;
        } while (inMemStartNC.super_CoreDims.DimCount != sVar26);
      }
      blockSize = ovlpStart.super_CoreDims.DimCount;
      local_ce8 = local_ce0;
      memset(local_ce0,0,0x100);
      if (sVar15 != 0) {
        memmove(local_ce0,ovlpStart.super_CoreDims.DimensSpan,sVar15 * 8);
      }
      pppppppcVar11 = (char *******)(&local_ce8 + sVar15);
      if (local_ce0 < pppppppcVar11 && sVar15 != 0) {
        pppppppcVar14 = local_ce0;
        do {
          pppppppcVar14 = pppppppcVar14 + 1;
          ppppppcVar1 = pppppppcVar14[-1];
          pppppppcVar14[-1] = *pppppppcVar11;
          *pppppppcVar11 = ppppppcVar1;
          pppppppcVar11 = pppppppcVar11 + -1;
        } while (pppppppcVar14 < pppppppcVar11);
      }
      if (outMemStartNC.super_CoreDims.DimCount != 0) {
        sVar15 = 0;
        do {
          outRltvOvlpStartPos.Dimensions[sVar15] = (long)local_ce0[sVar15] - psVar2[sVar15];
          sVar15 = sVar15 + 1;
        } while (outMemStartNC.super_CoreDims.DimCount != sVar15);
      }
    }
    else if (outIsRowMajor && bVar3 == 0) {
      psVar13 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = sVar15;
      revInStart.super_CoreDims.DimensSpan = psVar13;
      memset(psVar13,0,0x100);
      if (sVar15 != 0) {
        memmove(psVar13,inStart->DimensSpan,sVar15 << 3);
      }
      pCVar4 = local_1360;
      sVar15 = local_1360->DimCount;
      minContDim = sVar15;
      local_bd8 = local_bd0;
      memset(local_bd0,0,0x100);
      if (sVar15 != 0) {
        memmove(local_bd0,pCVar4->DimensSpan,sVar15 << 3);
      }
      psVar7 = inMemCountNC.super_CoreDims.DimensSpan;
      psVar6 = inEnd.super_CoreDims.DimensSpan;
      psVar5 = outEnd.super_CoreDims.DimensSpan;
      psVar2 = inMemStartNC.super_CoreDims.DimensSpan;
      sVar15 = ovlpStart.super_CoreDims.DimCount;
      psVar8 = inMemStartNC.super_CoreDims.DimensSpan + (inMemStartNC.super_CoreDims.DimCount - 1);
      psVar13 = inMemStartNC.super_CoreDims.DimensSpan;
      if (inMemStartNC.super_CoreDims.DimensSpan < psVar8 &&
          inMemStartNC.super_CoreDims.DimCount != 0) {
        do {
          psVar12 = psVar13 + 1;
          sVar26 = *psVar13;
          *psVar13 = *psVar8;
          *psVar8 = sVar26;
          psVar8 = psVar8 + -1;
          psVar13 = psVar12;
        } while (psVar12 < psVar8);
      }
      psVar8 = inMemCountNC.super_CoreDims.DimensSpan + (inMemCountNC.super_CoreDims.DimCount - 1);
      psVar13 = inMemCountNC.super_CoreDims.DimensSpan;
      if (inMemCountNC.super_CoreDims.DimensSpan < psVar8 &&
          inMemCountNC.super_CoreDims.DimCount != 0) {
        do {
          psVar12 = psVar13 + 1;
          sVar26 = *psVar13;
          *psVar13 = *psVar8;
          *psVar8 = sVar26;
          psVar8 = psVar8 + -1;
          psVar13 = psVar12;
        } while (psVar12 < psVar8);
      }
      if (revInStart.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          inEnd.super_CoreDims.DimensSpan[uVar17] =
               (size_t)(local_bd0[uVar17] + (revInStart.Dimensions[uVar17] - 1));
          uVar17 = uVar17 + 1;
        } while (uVar17 < revInStart.super_CoreDims.DimCount);
      }
      if (outStart->DimCount != 0) {
        psVar13 = outStart->DimensSpan;
        psVar8 = outCount->DimensSpan;
        uVar17 = 0;
        do {
          outEnd.super_CoreDims.DimensSpan[uVar17] = (psVar13[uVar17] + psVar8[uVar17]) - 1;
          uVar17 = uVar17 + 1;
        } while (uVar17 < outStart->DimCount);
      }
      if (ovlpStart.super_CoreDims.DimCount != 0) {
        psVar13 = outStart->DimensSpan;
        uVar17 = 0;
        do {
          uVar10 = psVar13[uVar17];
          if (psVar13[uVar17] < revInStart.Dimensions[uVar17]) {
            uVar10 = revInStart.Dimensions[uVar17];
          }
          ovlpStart.super_CoreDims.DimensSpan[uVar17] = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpStart.super_CoreDims.DimCount);
      }
      if (ovlpEnd.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          uVar10 = psVar5[uVar17];
          if (psVar6[uVar17] < psVar5[uVar17]) {
            uVar10 = psVar6[uVar17];
          }
          ovlpEnd.Dimensions[uVar17] = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpEnd.super_CoreDims.DimCount);
      }
      if (ovlpCount.super_CoreDims.DimCount != 0) {
        uVar17 = 0;
        do {
          ovlpCount.Dimensions[uVar17] =
               (ovlpEnd.Dimensions[uVar17] - ovlpStart.super_CoreDims.DimensSpan[uVar17]) + 1;
          uVar17 = uVar17 + 1;
        } while (uVar17 < ovlpCount.super_CoreDims.DimCount);
      }
      bVar25 = ovlpStart.super_CoreDims.DimCount == 0;
      if (!bVar25) {
        if (ovlpEnd.Dimensions[0] < *ovlpStart.super_CoreDims.DimensSpan) {
          return 1;
        }
        uVar17 = 1;
        do {
          uVar10 = uVar17;
          if (ovlpStart.super_CoreDims.DimCount == uVar10) break;
          uVar17 = uVar10 + 1;
        } while (ovlpStart.super_CoreDims.DimensSpan[uVar10] <= ovlpEnd.Dimensions[uVar10]);
        bVar25 = ovlpStart.super_CoreDims.DimCount <= uVar10;
      }
      if (!bVar25) {
        return 1;
      }
      sVar26 = (size_t)typeSize;
      outStride.Dimensions[outStride.super_CoreDims.DimCount - 1] = sVar26;
      if (1 < outStride.super_CoreDims.DimCount) {
        outStride.Dimensions[outStride.super_CoreDims.DimCount - 2] =
             outMemCountNC.super_CoreDims.DimensSpan[outStride.super_CoreDims.DimCount - 1] * sVar26
        ;
      }
      psVar13 = outMemCountNC.super_CoreDims.DimensSpan;
      if (2 < outStride.super_CoreDims.DimCount) {
        sVar23 = outStride.Dimensions[outStride.super_CoreDims.DimCount - 2];
        sVar18 = outStride.super_CoreDims.DimCount;
        do {
          sVar23 = sVar23 * psVar13[sVar18 - 2];
          outStride.Dimensions[sVar18 - 3] = sVar23;
          sVar18 = sVar18 - 1;
        } while (sVar18 != 2);
      }
      inStride.Dimensions[inStride.super_CoreDims.DimCount - 1] = sVar26;
      if (1 < inStride.super_CoreDims.DimCount) {
        inStride.Dimensions[inStride.super_CoreDims.DimCount - 2] =
             sVar26 * psVar7[inStride.super_CoreDims.DimCount - 1];
      }
      if (2 < inStride.super_CoreDims.DimCount) {
        sVar26 = inStride.Dimensions[inStride.super_CoreDims.DimCount - 2];
        sVar23 = inStride.super_CoreDims.DimCount;
        do {
          sVar26 = sVar26 * psVar7[sVar23 - 2];
          *(size_t *)(&local_1358 + sVar23 * 2) = sVar26;
          sVar23 = sVar23 - 1;
        } while (sVar23 != 2);
      }
      ppsVar9 = (size_t **)(inStride.Dimensions + (inStride.super_CoreDims.DimCount - 1));
      if (inStride.Dimensions < ppsVar9 && inStride.super_CoreDims.DimCount != 0) {
        psVar13 = inStride.Dimensions;
        do {
          psVar13 = psVar13 + 1;
          sVar26 = psVar13[-1];
          psVar13[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar26;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar13 < ppsVar9);
      }
      blockSize = sVar15;
      local_ce8 = local_ce0;
      memset(local_ce0,0,0x100);
      if (sVar15 != 0) {
        memmove(local_ce0,ovlpStart.super_CoreDims.DimensSpan,sVar15 * 8);
      }
      pppppppcVar11 = (char *******)(&local_ce8 + sVar15);
      if (local_ce0 < pppppppcVar11 && sVar15 != 0) {
        pppppppcVar14 = local_ce0;
        do {
          pppppppcVar14 = pppppppcVar14 + 1;
          ppppppcVar1 = pppppppcVar14[-1];
          pppppppcVar14[-1] = *pppppppcVar11;
          *pppppppcVar11 = ppppppcVar1;
          pppppppcVar11 = pppppppcVar11 + -1;
        } while (pppppppcVar14 < pppppppcVar11);
      }
      if (inMemStartNC.super_CoreDims.DimCount != 0) {
        sVar15 = 0;
        do {
          inRltvOvlpStartPos.Dimensions[sVar15] = (long)local_ce0[sVar15] - psVar2[sVar15];
          sVar15 = sVar15 + 1;
        } while (inMemStartNC.super_CoreDims.DimCount != sVar15);
      }
      if (outMemStartNC.super_CoreDims.DimCount != 0) {
        sVar15 = 0;
        do {
          outRltvOvlpStartPos.Dimensions[sVar15] =
               ovlpStart.super_CoreDims.DimensSpan[sVar15] -
               outMemStartNC.super_CoreDims.DimensSpan[sVar15];
          sVar15 = sVar15 + 1;
        } while (outMemStartNC.super_CoreDims.DimCount != sVar15);
      }
    }
    sVar15 = ovlpCount.super_CoreDims.DimCount;
    local_1378 = local_1368;
    elmSize = (size_t)typeSize;
    if ((bool)(char)local_1358 == outIsLittleEndian) {
      if (safeMode) {
        revInStart.super_CoreDims.DimCount = ovlpCount.super_CoreDims.DimCount + 1;
        psVar13 = revInStart.Dimensions;
        local_1370 = in;
        revInStart.super_CoreDims.DimensSpan = psVar13;
        memset(psVar13,0,0x100);
        if (sVar15 + 1 != 0) {
          memset(psVar13,0,sVar15 * 8 + 8);
        }
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minContDim,sVar15 + 1,
                   (allocator_type *)&blockSize);
        *(char **)minContDim = in;
        std::vector<char_*,_std::allocator<char_*>_>::vector
                  ((vector<char_*,_std::allocator<char_*>_> *)&blockSize,
                   ovlpCount.super_CoreDims.DimCount + 1,&local_1379);
        *(char **)blockSize = local_1368;
        sVar15 = 0;
        do {
          for (; sVar15 != inStride.super_CoreDims.DimCount; sVar15 = sVar15 + 1) {
            *(size_t *)(minContDim + 8 + sVar15 * 8) =
                 (revInStart.super_CoreDims.DimensSpan[sVar15] +
                 inRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar15]) *
                 inStride.super_CoreDims.DimensSpan[sVar15] + *(long *)(minContDim + sVar15 * 8);
            *(size_t *)(blockSize + 8 + sVar15 * 8) =
                 (revInStart.super_CoreDims.DimensSpan[sVar15] +
                 outRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar15]) *
                 outStride.super_CoreDims.DimensSpan[sVar15] + *(long *)(blockSize + sVar15 * 8);
            revInStart.super_CoreDims.DimensSpan[sVar15] =
                 revInStart.super_CoreDims.DimensSpan[sVar15] + 1;
          }
          memcpy(*(void **)(blockSize + sVar15 * 8),*(void **)(minContDim + sVar15 * 8),elmSize);
          sVar26 = sVar15;
          do {
            sVar15 = sVar26 - 1;
            if (sVar26 == 0) {
              if (blockSize != 0) {
                operator_delete((void *)blockSize);
              }
              goto joined_r0x003fdcff;
            }
            revInStart.super_CoreDims.DimensSpan[sVar26] = 0;
            sVar26 = sVar15;
          } while (revInStart.super_CoreDims.DimensSpan[sVar15] ==
                   ovlpCount.super_CoreDims.DimensSpan[sVar15]);
        } while( true );
      }
      local_1370 = in;
      NdCopyRecurDFNonSeqDynamic
                (0,in,local_1368,&inRltvOvlpStartPos.super_CoreDims,
                 &outRltvOvlpStartPos.super_CoreDims,&inStride.super_CoreDims,
                 &outStride.super_CoreDims,&ovlpCount.super_CoreDims,elmSize);
    }
    else {
      if (safeMode) {
        revInStart.super_CoreDims.DimCount = ovlpCount.super_CoreDims.DimCount + 1;
        psVar13 = revInStart.Dimensions;
        local_1370 = in;
        revInStart.super_CoreDims.DimensSpan = psVar13;
        memset(psVar13,0,0x100);
        if (sVar15 + 1 != 0) {
          memset(psVar13,0,sVar15 * 8 + 8);
        }
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minContDim,sVar15 + 1,
                   (allocator_type *)&blockSize);
        *(char **)minContDim = in;
        std::vector<char_*,_std::allocator<char_*>_>::vector
                  ((vector<char_*,_std::allocator<char_*>_> *)&blockSize,
                   ovlpCount.super_CoreDims.DimCount + 1,&local_1379);
        *(char **)blockSize = local_1368;
        sVar15 = 0;
        do {
          for (; sVar15 != inStride.super_CoreDims.DimCount; sVar15 = sVar15 + 1) {
            *(size_t *)(minContDim + 8 + sVar15 * 8) =
                 (revInStart.super_CoreDims.DimensSpan[sVar15] +
                 inRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar15]) *
                 inStride.super_CoreDims.DimensSpan[sVar15] + *(long *)(minContDim + sVar15 * 8);
            *(size_t *)(blockSize + 8 + sVar15 * 8) =
                 (revInStart.super_CoreDims.DimensSpan[sVar15] +
                 outRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar15]) *
                 outStride.super_CoreDims.DimensSpan[sVar15] + *(long *)(blockSize + sVar15 * 8);
            revInStart.super_CoreDims.DimensSpan[sVar15] =
                 revInStart.super_CoreDims.DimensSpan[sVar15] + 1;
          }
          if (typeSize != 0) {
            lVar19 = 0;
            sVar16 = elmSize;
            do {
              *(undefined1 *)(*(long *)(blockSize + sVar15 * 8) + lVar19) =
                   *(undefined1 *)(*(long *)(minContDim + sVar15 * 8) + -1 + sVar16);
              lVar19 = lVar19 + 1;
              sVar16 = sVar16 - 1;
            } while (sVar16 != 0);
          }
          do {
            sVar26 = sVar15 - 1;
            if (sVar15 == 0) {
              if (blockSize != 0) {
                operator_delete((void *)blockSize);
              }
joined_r0x003fdcff:
              if ((void *)minContDim != (void *)0x0) {
                operator_delete((void *)minContDim);
              }
              return 0;
            }
            revInStart.super_CoreDims.DimensSpan[sVar15] = 0;
            sVar15 = sVar26;
          } while (revInStart.super_CoreDims.DimensSpan[sVar26] ==
                   ovlpCount.super_CoreDims.DimensSpan[sVar26]);
        } while( true );
      }
      local_1370 = in;
      NdCopyRecurDFNonSeqDynamicRevEndian
                (0,in,local_1368,&inRltvOvlpStartPos.super_CoreDims,
                 &outRltvOvlpStartPos.super_CoreDims,&inStride.super_CoreDims,
                 &outStride.super_CoreDims,&ovlpCount.super_CoreDims,elmSize);
    }
  }
  return 0;
}

Assistant:

int NdCopy(const char *in, const CoreDims &inStart, const CoreDims &inCount,
           const bool inIsRowMajor, const bool inIsLittleEndian, char *out,
           const CoreDims &outStart, const CoreDims &outCount, const bool outIsRowMajor,
           const bool outIsLittleEndian, const int typeSize, const CoreDims &inMemStart,
           const CoreDims &inMemCount, const CoreDims &outMemStart, const CoreDims &outMemCount,
           const bool safeMode, const MemorySpace MemSpace, const bool duringWrite)

{

    // use values of ioStart and ioCount if ioMemStart and ioMemCount are
    // left as default
    DimsArray inMemStartNC = inMemStart.empty() ? inStart : inMemStart;
    DimsArray inMemCountNC = inMemCount.empty() ? inCount : inMemCount;
    DimsArray outMemStartNC = outMemStart.empty() ? outStart : outMemStart;
    DimsArray outMemCountNC = outMemCount.empty() ? outCount : outMemCount;

    DimsArray inEnd(inStart.size());
    DimsArray outEnd(inStart.size());
    DimsArray ovlpStart(inStart.size());
    DimsArray ovlpEnd(inStart.size());
    DimsArray ovlpCount(inStart.size());
    DimsArray inStride(inStart.size());
    DimsArray outStride(inStart.size());
    DimsArray inOvlpGapSize(inStart.size());
    DimsArray outOvlpGapSize(inStart.size());
    DimsArray inRltvOvlpStartPos(inStart.size());
    DimsArray outRltvOvlpStartPos(inStart.size());
    size_t minContDim, blockSize;
    const char *inOvlpBase = nullptr;
    char *outOvlpBase = nullptr;
    auto GetInEnd = [](CoreDims &inEnd, const CoreDims &inStart, const CoreDims &inCount) {
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inEnd[i] = inStart[i] + inCount[i] - 1;
        }
    };
    auto GetOutEnd = [](CoreDims &outEnd, const CoreDims &outStart, const CoreDims &output_count) {
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outEnd[i] = outStart[i] + output_count[i] - 1;
        }
    };
    auto GetOvlpStart = [](CoreDims &ovlpStart, const CoreDims &inStart, const CoreDims &outStart) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            ovlpStart[i] = inStart[i] > outStart[i] ? inStart[i] : outStart[i];
        }
    };
    auto GetOvlpEnd = [](CoreDims &ovlpEnd, CoreDims &inEnd, CoreDims &outEnd) {
        for (size_t i = 0; i < ovlpEnd.size(); i++)
        {
            ovlpEnd[i] = inEnd[i] < outEnd[i] ? inEnd[i] : outEnd[i];
        }
    };
    auto GetOvlpCount = [](CoreDims &ovlpCount, CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpCount.size(); i++)
        {
            ovlpCount[i] = ovlpEnd[i] - ovlpStart[i] + 1;
        }
    };
    auto HasOvlp = [](CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            if (ovlpEnd[i] < ovlpStart[i])
            {
                return false;
            }
        }
        return true;
    };

    auto GetIoStrides = [](CoreDims &ioStride, const CoreDims &ioCount, size_t elmSize) {
        // ioStride[i] holds the total number of elements under each element
        // of the i'th dimension
        ioStride[ioStride.size() - 1] = elmSize;
        if (ioStride.size() > 1)
        {
            ioStride[ioStride.size() - 2] = ioCount[ioStride.size() - 1] * elmSize;
        }
        if (ioStride.size() > 2)
        {
            size_t i = ioStride.size() - 3;
            while (true)
            {
                ioStride[i] = ioCount[i + 1] * ioStride[i + 1];
                if (i == 0)
                {
                    break;
                }
                else
                {
                    i--;
                }
            }
        }
    };

    auto GetInOvlpBase = [](const char *&inOvlpBase, const char *in, const CoreDims &inStart,
                            CoreDims &inStride, CoreDims &ovlpStart) {
        inOvlpBase = in;
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inOvlpBase = inOvlpBase + (ovlpStart[i] - inStart[i]) * inStride[i];
        }
    };
    auto GetOutOvlpBase = [](char *&outOvlpBase, char *out, const CoreDims &outStart,
                             CoreDims &outStride, CoreDims &ovlpStart) {
        outOvlpBase = out;
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outOvlpBase = outOvlpBase + (ovlpStart[i] - outStart[i]) * outStride[i];
        }
    };
    auto GetIoOvlpGapSize = [](CoreDims &ioOvlpGapSize, CoreDims &ioStride, const CoreDims &ioCount,
                               CoreDims &ovlpCount) {
        for (size_t i = 0; i < ioOvlpGapSize.size(); i++)
        {
            ioOvlpGapSize[i] = (ioCount[i] - ovlpCount[i]) * ioStride[i];
        }
    };
    auto GetMinContDim = [](const CoreDims &inCount, const CoreDims &outCount,
                            CoreDims &ovlpCount) {
        //    note: minContDim is the first index where its input box and
        //    overlap box
        //    are not fully match. therefore all data below this branch is
        //    contingous
        //    and this determins the Biggest continuous block size - Each
        //    element of the
        //    current dimension.
        size_t i = ovlpCount.size() - 1;
        while (true)
        {
            if (i == 0)
            {
                break;
            }
            if ((inCount[i] != ovlpCount[i]) || (outCount[i] != ovlpCount[i]))
            {
                break;
            }
            i--;
        }
        return i;
    };
    auto GetBlockSize = [](CoreDims &ovlpCount, size_t minContDim, size_t elmSize) {
        size_t res = elmSize;
        for (size_t i = minContDim; i < ovlpCount.size(); i++)
        {
            res *= ovlpCount[i];
        }
        return res;
    };

    auto GetRltvOvlpStartPos = [](CoreDims &ioRltvOvlpStart, const CoreDims &ioStart,
                                  CoreDims &ovlpStart) {
        for (size_t i = 0; i < ioStart.size(); i++)
        {
            ioRltvOvlpStart[i] = ovlpStart[i] - ioStart[i];
        }
    };

    // main flow
    // row-major ==> row-major mode
    // algrithm optimizations:
    // 1. contigous data copying
    // 2. mem pointer arithmetics by sequential padding. O(1) overhead/block
    if (inIsRowMajor && outIsRowMajor)
    {
        GetInEnd(inEnd, inStart, inCount);
        GetOutEnd(outEnd, outStart, outCount);
        GetOvlpStart(ovlpStart, inStart, outStart);
        GetOvlpEnd(ovlpEnd, inEnd, outEnd);
        GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
        if (!HasOvlp(ovlpStart, ovlpEnd))
        {
            return 1; // no overlap found
        }
        GetIoStrides(inStride, inMemCountNC, typeSize);
        GetIoStrides(outStride, outMemCountNC, typeSize);
        GetIoOvlpGapSize(inOvlpGapSize, inStride, inMemCountNC, ovlpCount);
        GetIoOvlpGapSize(outOvlpGapSize, outStride, outMemCountNC, ovlpCount);
        GetInOvlpBase(inOvlpBase, in, inMemStartNC, inStride, ovlpStart);
        GetOutOvlpBase(outOvlpBase, out, outMemStartNC, outStride, ovlpStart);
        minContDim = GetMinContDim(inMemCountNC, outMemCountNC, ovlpCount);
        blockSize = GetBlockSize(ovlpCount, minContDim, typeSize);
        // same endianess mode: most optimized, contiguous data copying
        // algorithm used.
        if (inIsLittleEndian == outIsLittleEndian)
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::NdCopyGPU(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize, ovlpCount,
                                  minContDim, blockSize, MemSpace, duringWrite);
                return 0;
            }
#endif
            // most efficient algm
            // warning: number of function stacks used is number of dimensions
            // of data.
            if (!safeMode)
            {
                NdCopyRecurDFSeqPadding(0, inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                        ovlpCount, minContDim, blockSize);
            }
            else // safeMode
            {
                //      //alternative iterative version, 10% slower then
                //      recursive
                //      //use it when very high demension is used.
                NdCopyIterDFSeqPadding(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                       ovlpCount, minContDim, blockSize);
            }
        }
        // different endianess mode
        else
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "Memory", "CopyContiguousMemory",
                    "Direct byte order reversal not supported for GPU buffers");
            }
#endif
            if (!safeMode)
            {
                NdCopyRecurDFSeqPaddingRevEndian(0, inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                 outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                 typeSize, blockSize / typeSize);
            }
            else
            {
                NdCopyIterDFSeqPaddingRevEndian(inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                typeSize, blockSize / typeSize);
            }
        }
    }

    // Copying modes involing col-major
    // algorithm optimization:
    // 1. mem ptr arithmetics: O(1) overhead per block, dynamic/non-sequential
    // padding
    else
    {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
        if (MemSpace == MemorySpace::GPU)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "Memory", "CopyContiguousMemory",
                "Direct byte order reversal not supported for GPU buffers");
        }
#endif
        //        CoreDims revInCount(inCount);
        //        CoreDims revOutCount(outCount);
        //
        // col-major ==> col-major mode
        if (!inIsRowMajor && !outIsRowMajor)
        {

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, inStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            GetIoStrides(inStride, inCount, typeSize);
            GetIoStrides(outStride, outCount, typeSize);

            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }
        // row-major ==> col-major mode
        else if (inIsRowMajor && !outIsRowMajor)
        {
            DimsArray revOutStart(outStart);
            DimsArray revOutCount(outCount);

            std::reverse(outMemStartNC.begin(), outMemStartNC.end());
            std::reverse(outMemCountNC.begin(), outMemCountNC.end());

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, revOutStart, revOutCount);
            GetOvlpStart(ovlpStart, inStart, revOutStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);

            // calulate reversed order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);
            // reverse outStride so that outStride aligns to inStride
            std::reverse(outStride.begin(), outStride.end());

            // get normal order inOvlpStart
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);

            // get reversed order outOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, revOvlpStart);
        }
        // col-major ==> row-major mode
        else if (!inIsRowMajor && outIsRowMajor)
        {
            DimsArray revInStart(inStart);
            DimsArray revInCount(inCount);
            std::reverse(inMemStartNC.begin(), inMemStartNC.end());
            std::reverse(inMemCountNC.begin(), inMemCountNC.end());

            GetInEnd(inEnd, revInStart, revInCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, revInStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);

            // calculate reversed inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);
            // reverse inStride so that inStride aligns to outStride
            std::reverse(inStride.begin(), inStride.end());

            // get reversed order inOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, revOvlpStart);
            // get normal order outOvlpStart
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }

        inOvlpBase = in;
        outOvlpBase = out;
        // Same Endian"
        if (inIsLittleEndian == outIsLittleEndian)
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamic(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                           outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                           typeSize);
            }
            else
            {
                NdCopyIterDFDynamic(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                    outRltvOvlpStartPos, inStride, outStride, ovlpCount, typeSize);
            }
        }
        // different Endian"
        else
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamicRevEndian(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                                    outRltvOvlpStartPos, inStride, outStride,
                                                    ovlpCount, typeSize);
            }
            else
            {
                NdCopyIterDFDynamicRevEndian(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                             outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                             typeSize);
            }
        }
    }
    return 0;
}